

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall TxConfirmStats::resizeInMemoryCounters(TxConfirmStats *this,size_t newbuckets)

{
  long lVar1;
  pointer pvVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->unconfTxs,
           (ulong)((int)(((long)(this->confAvg).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->confAvg).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18) * this->scale));
  uVar3 = 0;
  while( true ) {
    pvVar2 = (this->unconfTxs).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->unconfTxs).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18) <=
        (ulong)uVar3) break;
    std::vector<int,_std::allocator<int>_>::resize(pvVar2 + uVar3,newbuckets);
    uVar3 = uVar3 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::vector<int,_std::allocator<int>_>::resize(&this->oldUnconfTxs,newbuckets);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::resizeInMemoryCounters(size_t newbuckets) {
    // newbuckets must be passed in because the buckets referred to during Read have not been updated yet.
    unconfTxs.resize(GetMaxConfirms());
    for (unsigned int i = 0; i < unconfTxs.size(); i++) {
        unconfTxs[i].resize(newbuckets);
    }
    oldUnconfTxs.resize(newbuckets);
}